

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::SplitArgumentLocked
          (FlagRegistry *this,char *arg,string *key,char **v,string *error_message)

{
  char *pcVar1;
  FlagValue *pFVar2;
  int iVar3;
  char *pcVar4;
  CommandLineFlag *pCVar5;
  long lVar6;
  string local_50;
  
  pcVar4 = strchr(arg,0x3d);
  if (pcVar4 == (char *)0x0) {
    pcVar1 = (char *)key->_M_string_length;
    strlen(arg);
    pcVar4 = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)key,0,pcVar1,(ulong)arg);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)key,0,(char *)key->_M_string_length,(ulong)arg);
    pcVar4 = pcVar4 + 1;
  }
  *v = pcVar4;
  pcVar4 = (key->_M_dataplus)._M_p;
  pCVar5 = FindFlagLocked(this,pcVar4);
  if (pCVar5 == (CommandLineFlag *)0x0) {
    if ((*pcVar4 == 'n') && (pcVar4[1] == 'o')) {
      pcVar1 = pcVar4 + 2;
      pCVar5 = FindFlagLocked(this,pcVar1);
      if (pCVar5 != (CommandLineFlag *)0x0) {
        pFVar2 = pCVar5->defvalue_;
        lVar6 = (long)pFVar2->type_;
        if (6 < lVar6) goto LAB_001942aa;
        iVar3 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar6 * 7,"bool");
        if (iVar3 != 0) {
          lVar6 = (long)pFVar2->type_;
          if (6 < lVar6) goto LAB_001942aa;
          StringPrintf_abi_cxx11_
                    (&local_50,"%sboolean value (%s) specified for %s command line flag\n","ERROR: "
                     ,pcVar4,&(anonymous_namespace)::FlagValue::TypeName()::types + lVar6 * 7);
          goto LAB_00194243;
        }
        pcVar4 = (char *)key->_M_string_length;
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)key,0,pcVar4,(ulong)pcVar1);
        *v = "0";
        goto LAB_00194119;
      }
    }
    StringPrintf_abi_cxx11_(&local_50,"%sunknown command line flag \'%s\'\n","ERROR: ",pcVar4);
LAB_00194243:
    std::__cxx11::string::operator=((string *)error_message,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return (CommandLineFlag *)0x0;
  }
LAB_00194119:
  if (*v != (char *)0x0) {
    return pCVar5;
  }
  lVar6 = (long)pCVar5->defvalue_->type_;
  if (lVar6 < 7) {
    iVar3 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar6 * 7,"bool");
    if (iVar3 != 0) {
      return pCVar5;
    }
    *v = "1";
    return pCVar5;
  }
LAB_001942aa:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const");
}

Assistant:

CommandLineFlag* FlagRegistry::SplitArgumentLocked(const char* arg,
                                                   string* key,
                                                   const char** v,
                                                   string* error_message) {
  // Find the flag object for this option
  const char* flag_name;
  const char* value = strchr(arg, '=');
  if (value == NULL) {
    key->assign(arg);
    *v = NULL;
  } else {
    // Strip out the "=value" portion from arg
    key->assign(arg, value-arg);
    *v = ++value;    // advance past the '='
  }
  flag_name = key->c_str();

  CommandLineFlag* flag = FindFlagLocked(flag_name);

  if (flag == NULL) {
    // If we can't find the flag-name, then we should return an error.
    // The one exception is if 1) the flag-name is 'nox', 2) there
    // exists a flag named 'x', and 3) 'x' is a boolean flag.
    // In that case, we want to return flag 'x'.
    if (!(flag_name[0] == 'n' && flag_name[1] == 'o')) {
      // flag-name is not 'nox', so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    flag = FindFlagLocked(flag_name+2);
    if (flag == NULL) {
      // No flag named 'x' exists, so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    if (strcmp(flag->type_name(), "bool") != 0) {
      // 'x' exists but is not boolean, so we're not in the exception case.
      *error_message = StringPrintf(
          "%sboolean value (%s) specified for %s command line flag\n",
          kError, key->c_str(), flag->type_name());
      return NULL;
    }
    // We're in the exception case!
    // Make up a fake value to replace the "no" we stripped out
    key->assign(flag_name+2);   // the name without the "no"
    *v = "0";
  }

  // Assign a value if this is a boolean flag
  if (*v == NULL && strcmp(flag->type_name(), "bool") == 0) {
    *v = "1";    // the --nox case was already handled, so this is the --x case
  }

  return flag;
}